

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_NoLogFiles::_Run(_Test_NoLogFiles *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Status local_230;
  string local_228;
  string local_208;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type sStack_1d0;
  Tester local_1c8;
  
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1c8.line_ = 0xce;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  paVar1 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"foo","");
  paVar2 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"bar","");
  local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p;
  sStack_1d0 = local_208._M_string_length;
  local_1e8 = local_228._M_dataplus._M_p._0_4_;
  uStack_1e4 = local_228._M_dataplus._M_p._4_4_;
  uStack_1e0 = (undefined4)local_228._M_string_length;
  uStack_1dc = local_228._M_string_length._4_4_;
  (*((this->super_RecoveryTest).db_)->_vptr_DB[2])(&local_230);
  test::Tester::IsOk(&local_1c8,&local_230);
  if (local_230.state_ != (char *)0x0) {
    operator_delete__(local_230.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1c8.line_ = 0xcf;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p._0_4_ = 1;
  local_208._M_dataplus._M_p = (pointer)RecoveryTest::DeleteLogFiles(&this->super_RecoveryTest);
  test::Tester::IsEq<int,unsigned_long>(&local_1c8,(int *)&local_228,(unsigned_long *)&local_208);
  test::Tester::~Tester(&local_1c8);
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1c8.line_ = 0xd1;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"foo","");
  RecoveryTest::Get(&local_208,&this->super_RecoveryTest,&local_228,(Snapshot *)0x0);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            (&local_1c8,(char (*) [10])"NOT_FOUND",&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1c8.line_ = 0xd3;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"foo","");
  RecoveryTest::Get(&local_208,&this->super_RecoveryTest,&local_228,(Snapshot *)0x0);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            (&local_1c8,(char (*) [10])"NOT_FOUND",&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  return;
}

Assistant:

TEST(RecoveryTest, NoLogFiles) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ(1, DeleteLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}